

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::
int_writer<unsigned__int128,fmt::v6::basic_format_specs<char>>::dec_writer::operator()
          (dec_writer *this,char **it)

{
  undefined1 value [16];
  char *pcVar1;
  undefined8 *in_RSI;
  undefined8 in_RDI;
  char *in_stack_00000008;
  int in_stack_ffffffffffffffec;
  
  value._8_8_ = in_RDI;
  value._0_8_ = in_RSI;
  pcVar1 = format_decimal<char,char*,unsigned__int128>
                     (in_stack_00000008,(unsigned___int128)value,in_stack_ffffffffffffffec);
  *in_RSI = pcVar1;
  return;
}

Assistant:

void operator()(It&& it) const {
        it = internal::format_decimal<char_type>(it, abs_value, num_digits);
      }